

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes,string *outputConfig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  cmGlobalNinjaGenerator *pcVar8;
  string *psVar9;
  cmRulePlaceholderExpander *this_00;
  cmOutputConverter *outputConverter;
  string *i;
  pointer s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view source;
  string_view arg;
  string cmdVar;
  string cudaCompileMode;
  string escapedSourceFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  RuleVariables compileObjectVars;
  string local_270;
  undefined8 local_250;
  char *local_248;
  string local_240;
  char *local_220;
  pointer local_218;
  char local_210;
  undefined7 uStack_20f;
  string local_200;
  string *local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  string *local_1b8;
  string *local_1b0;
  string *local_1a8;
  string local_1a0;
  undefined1 local_180 [48];
  pointer local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer local_a8;
  pointer local_a0;
  char *local_50;
  undefined4 extraout_var;
  
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_1b0 = objectDir;
  local_1a8 = objectFileDir;
  local_180._0_8_ = local_180 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"EXPORT_COMPILE_COMMANDS","");
  bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)local_180);
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  if (bVar6) {
    memset(local_180,0,0x150);
    local_150 = (language->_M_dataplus)._M_p;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    pcVar3 = (sourceFileName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,pcVar3,pcVar3 + sourceFileName->_M_string_length);
    bVar6 = cmsys::SystemTools::FileIsFullPath(sourceFileName);
    if (!bVar6) {
      pcVar8 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      psVar9 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((pcVar8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      cmsys::SystemTools::CollapseFullPath(&local_270,&local_200,psVar9);
      std::__cxx11::string::operator=((string *)&local_200,(string *)&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
    }
    source._M_str = local_200._M_dataplus._M_p;
    source._M_len = local_200._M_string_length;
    local_1e0 = objectFileName;
    local_1b8 = sourceFileName;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_270,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source,SHELL);
    std::__cxx11::string::operator=((string *)&local_200,(string *)&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p;
    local_100 = (local_1e0->_M_dataplus)._M_p;
    local_f8 = (local_1b0->_M_dataplus)._M_p;
    local_f0 = (local_1a8->_M_dataplus)._M_p;
    local_e8 = (flags->_M_dataplus)._M_p;
    local_a8 = (defines->_M_dataplus)._M_p;
    local_a0 = (includes->_M_dataplus)._M_p;
    local_220 = &local_210;
    local_218 = (pointer)0x0;
    local_210 = '\0';
    iVar7 = std::__cxx11::string::compare((char *)language);
    paVar1 = &local_270.field_2;
    if (iVar7 == 0) {
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      local_270._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_270,"CUDA_SEPARABLE_COMPILATION","");
      bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
        local_270._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,"_CMAKE_CUDA_RDC_FLAG","");
        psVar9 = cmMakefile::GetRequiredDefinition(pcVar4,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar1) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        local_270.field_2._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_270.field_2._M_allocated_capacity = psVar9->_M_string_length;
        local_270._M_dataplus._M_p = local_218;
        local_270._M_string_length = (size_type)local_220;
        local_250 = 1;
        local_248 = " ";
        views._M_len = 3;
        views._M_array = (iterator)&local_270;
        cmCatViews_abi_cxx11_(&local_240,views);
        std::__cxx11::string::operator=((string *)&local_220,(string *)&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      local_270._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_270,"CUDA_PTX_COMPILATION","");
      bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
      if (bVar6) {
        local_270._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,"_CMAKE_CUDA_PTX_FLAG","");
        psVar9 = cmMakefile::GetRequiredDefinition(pcVar4,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar1) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        local_270.field_2._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_270.field_2._M_allocated_capacity = psVar9->_M_string_length;
        local_270._M_dataplus._M_p = local_218;
        local_270._M_string_length = (size_type)local_220;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_270;
        cmCatViews_abi_cxx11_(&local_240,views_00);
      }
      else {
        local_270._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,"_CMAKE_CUDA_WHOLE_FLAG","");
        psVar9 = cmMakefile::GetRequiredDefinition(pcVar4,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar1) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        local_270.field_2._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_270.field_2._M_allocated_capacity = psVar9->_M_string_length;
        local_270._M_dataplus._M_p = local_218;
        local_270._M_string_length = (size_type)local_220;
        views_01._M_len = 2;
        views_01._M_array = (iterator)&local_270;
        cmCatViews_abi_cxx11_(&local_240,views_01);
      }
      std::__cxx11::string::operator=((string *)&local_220,(string *)&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      local_50 = local_220;
    }
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_270.field_2._8_8_ = (language->_M_dataplus)._M_p;
    local_270.field_2._M_allocated_capacity = language->_M_string_length;
    local_270._M_dataplus._M_p = (pointer)0x6;
    local_270._M_string_length = 0x773473;
    local_250 = 0xf;
    local_248 = "_COMPILE_OBJECT";
    views_02._M_len = 3;
    views_02._M_array = (iterator)&local_270;
    cmCatViews_abi_cxx11_(&local_240,views_02);
    psVar9 = cmMakefile::GetRequiredDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,&local_240);
    arg._M_str = (psVar9->_M_dataplus)._M_p;
    arg._M_len = psVar9->_M_string_length;
    cmExpandList(arg,&local_1d8,false);
    iVar7 = (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              _vptr_cmLocalGenerator[5])();
    pbVar5 = local_1d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar7);
    if (local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      s = local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        outputConverter =
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter;
        if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
          outputConverter = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (this_00,outputConverter,s,(RuleVariables *)local_180);
        s = s + 1;
      } while (s != pbVar5);
    }
    local_1a0._M_string_length = 0;
    local_1a0.field_2._M_local_buf[0] = '\0';
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_270,this->LocalGenerator,&local_1d8,outputConfig,outputConfig,&local_1a0,
               (cmGeneratorTarget *)0x0);
    psVar9 = local_1b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,
                      CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                               local_1a0.field_2._M_local_buf[0]) + 1);
    }
    pcVar8 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar8,&local_270,psVar9,local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (this_00 != (cmRulePlaceholderExpander *)0x0) {
      (*(this_00->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
    if (local_220 != &local_210) {
      operator_delete(local_220,CONCAT71(uStack_20f,local_210) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes,
  std::string const& outputConfig)
{
  if (!this->GeneratorTarget->GetPropertyAsBool("EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    escapedSourceFileName =
      cmSystemTools::CollapseFullPath(escapedSourceFileName,
                                      this->GetGlobalGenerator()
                                        ->GetCMakeInstance()
                                        ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Rule for compiling object file.
  std::string cudaCompileMode;
  if (language == "CUDA") {
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      const std::string& rdcFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_RDC_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, rdcFlag, " ");
    }
    if (this->GeneratorTarget->GetPropertyAsBool("CUDA_PTX_COMPILATION")) {
      const std::string& ptxFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_PTX_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, ptxFlag);
    } else {
      const std::string& wholeFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_WHOLE_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, wholeFlag);
    }
    compileObjectVars.CudaCompileMode = cudaCompileMode.c_str();
  }

  std::vector<std::string> compileCmds;
  const std::string cmdVar = cmStrCat("CMAKE_", language, "_COMPILE_OBJECT");
  const std::string& compileCmd =
    this->Makefile->GetRequiredDefinition(cmdVar);
  cmExpandList(compileCmd, compileCmds);

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  for (std::string& i : compileCmds) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 compileObjectVars);
  }

  std::string cmdLine = this->GetLocalGenerator()->BuildCommandLine(
    compileCmds, outputConfig, outputConfig);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName,
                                                   objectFileName);
}